

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_remove_node(lyxp_set *set,uint32_t idx)

{
  uint32_t idx_local;
  lyxp_set *set_local;
  
  if ((set != (lyxp_set *)0x0) && (set->type == LYXP_SET_NODE_SET)) {
    if (idx < set->used) {
      set->used = set->used - 1;
      if (set->used == 0) {
        free((set->val).nodes);
        memset(set,0,0x30);
      }
      else {
        memmove((set->val).nodes + idx,(set->val).nodes + (idx + 1),(ulong)(set->used - idx) << 4);
      }
      return;
    }
    __assert_fail("idx < set->used",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x300,"void set_remove_node(struct lyxp_set *, uint32_t)");
  }
  __assert_fail("set && (set->type == LYXP_SET_NODE_SET)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x2ff,"void set_remove_node(struct lyxp_set *, uint32_t)");
}

Assistant:

static void
set_remove_node(struct lyxp_set *set, uint32_t idx)
{
    assert(set && (set->type == LYXP_SET_NODE_SET));
    assert(idx < set->used);

    --set->used;
    if (set->used) {
        memmove(&set->val.nodes[idx], &set->val.nodes[idx + 1],
                (set->used - idx) * sizeof *set->val.nodes);
    } else {
        free(set->val.nodes);
        /* this changes it to LYXP_SET_EMPTY */
        memset(set, 0, sizeof *set);
    }
}